

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void TestOneTruncate(char *path,int64 limit,int64 keep,int64 dsize,int64 ksize,int64 expect)

{
  int __fd;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  ostream *poVar4;
  string *psVar5;
  __off_t _Var6;
  void *__s;
  long lVar7;
  long lVar8;
  size_t size;
  LogMessage local_108;
  CheckOpString local_f8;
  undefined8 uStack_f0;
  string *local_e8;
  char *local_e0;
  long local_d8;
  int64 local_d0;
  int64 local_c8;
  stat statbuf;
  
  local_e8 = (string *)expect;
  local_e0 = path;
  local_d0 = limit;
  __fd = open(path,0x242,0x180);
  if (__fd == -1) {
    local_108.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
    local_108.data_ = (LogMessageData *)0x0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&statbuf,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x308,3,0,expect);
    poVar4 = google::LogMessage::stream((LogMessage *)&statbuf);
    std::operator<<(poVar4,"fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&statbuf);
  }
  local_d8 = ksize;
  local_c8 = keep;
  for (lVar8 = 0; lVar7 = local_d8, lVar2 = dsize - lVar8, lVar2 != 0 && lVar8 <= dsize;
      lVar8 = lVar8 + (int)lVar2) {
    if (9 < lVar2) {
      lVar2 = 10;
    }
    sVar3 = write(__fd,"DISCARDME!",(long)(int)lVar2);
    if (sVar3 == -1) {
      local_108.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_108.data_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&statbuf,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x311,3,0,expect);
      poVar4 = google::LogMessage::stream((LogMessage *)&statbuf);
      std::operator<<(poVar4,"write(fd, discardstr, bytes)");
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&statbuf);
    }
  }
  for (lVar8 = 0; lVar2 = lVar7 - lVar8, lVar2 != 0 && lVar8 <= lVar7; lVar8 = lVar8 + (int)lVar2) {
    if (6 < lVar2) {
      lVar2 = 7;
    }
    sVar3 = write(__fd,"KEEPME!",(long)(int)lVar2);
    if (sVar3 == -1) {
      local_108.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_108.data_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&statbuf,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x317,3,0,expect);
      poVar4 = google::LogMessage::stream((LogMessage *)&statbuf);
      std::operator<<(poVar4,"write(fd, keepstr, bytes)");
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&statbuf);
    }
  }
  google::TruncateLogFile(local_e0,local_d0,local_c8);
  iVar1 = fstat(__fd,(stat *)&statbuf);
  if (iVar1 == -1) {
    local_f8.str_ = (string *)google::LogMessage::SendToLog;
    uStack_f0 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,799,3,0,expect);
    poVar4 = google::LogMessage::stream(&local_108);
    std::operator<<(poVar4,"fstat(fd, &statbuf)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_108);
  }
  local_108.allocated_ = (LogMessageData *)statbuf.st_size;
  local_f8.str_ = local_e8;
  psVar5 = google::Check_EQImpl<long,long>
                     ((long *)&local_108,(long *)&local_f8,"statbuf.st_size == expect");
  if (psVar5 == (string *)0x0) {
    _Var6 = lseek(__fd,0,0);
    if (_Var6 == -1) {
      local_f8.str_ = (string *)google::LogMessage::SendToLog;
      uStack_f0 = 0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x321,3,0,expect);
      poVar4 = google::LogMessage::stream(&local_108);
      std::operator<<(poVar4,"lseek(fd, 0, SEEK_SET)");
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_108);
    }
    size = statbuf.st_size + 1;
    __s = operator_new(size);
    memset(__s,0,size);
    sVar3 = read(__fd,__s,size);
    if (sVar3 == -1) {
      local_f8.str_ = (string *)google::LogMessage::SendToLog;
      uStack_f0 = 0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x327,3,0,expect);
      poVar4 = google::LogMessage::stream(&local_108);
      std::operator<<(poVar4,"read(fd, buf, buf_size)");
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_108);
    }
    lVar8 = 0;
    do {
      lVar7 = (long)local_e8 - lVar8;
      if (lVar7 == 0 || (long)local_e8 < lVar8) {
        close(__fd);
        free(__s);
        return;
      }
      if (6 < lVar7) {
        lVar7 = 7;
      }
      iVar1 = bcmp(__s,"KEEPME!",(long)(int)lVar7);
      lVar8 = lVar8 + (int)lVar7;
    } while (iVar1 == 0);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x32d);
    poVar4 = google::LogMessage::stream(&local_108);
    std::operator<<(poVar4,"Check failed: !memcmp(p, keepstr, bytes) ");
  }
  else {
    local_f8.str_ = psVar5;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,800,&local_f8);
    google::LogMessage::stream(&local_108);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_108);
}

Assistant:

static void TestOneTruncate(const char *path, int64 limit, int64 keep,
                            int64 dsize, int64 ksize, int64 expect) {
  int fd;
  CHECK_ERR(fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600));

  const char *discardstr = "DISCARDME!", *keepstr = "KEEPME!";
  const size_t discard_size = strlen(discardstr), keep_size = strlen(keepstr);

  // Fill the file with the requested data; first discard data, then kept data
  int64 written = 0;
  while (written < dsize) {
    int bytes = min<int64>(dsize - written, discard_size);
    CHECK_ERR(write(fd, discardstr, bytes));
    written += bytes;
  }
  written = 0;
  while (written < ksize) {
    int bytes = min<int64>(ksize - written, keep_size);
    CHECK_ERR(write(fd, keepstr, bytes));
    written += bytes;
  }

  TruncateLogFile(path, limit, keep);

  // File should now be shorter
  struct stat statbuf;
  CHECK_ERR(fstat(fd, &statbuf));
  CHECK_EQ(statbuf.st_size, expect);
  CHECK_ERR(lseek(fd, 0, SEEK_SET));

  // File should contain the suffix of the original file
  const size_t buf_size = statbuf.st_size + 1;
  char* buf = new char[buf_size];
  memset(buf, 0, buf_size);
  CHECK_ERR(read(fd, buf, buf_size));

  const char *p = buf;
  int64 checked = 0;
  while (checked < expect) {
    int bytes = min<int64>(expect - checked, keep_size);
    CHECK(!memcmp(p, keepstr, bytes));
    checked += bytes;
  }
  close(fd);
  delete[] buf;
}